

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_atomic_cmpxchg_i64_riscv32
               (TCGContext_conflict9 *tcg_ctx,TCGv_i64 retv,TCGv_i32 addr,TCGv_i64 cmpv,
               TCGv_i64 newv,TCGArg idx,MemOp memop)

{
  MemOp opc;
  uint uVar1;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  TCGOp *pTVar4;
  TCGTemp *ts;
  uintptr_t o_4;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 val;
  uintptr_t o_2;
  TCGTemp *args [1];
  uint local_58;
  TCGTemp *local_38;
  
  opc = memop & ~MO_BE;
  if ((memop & MO_64) != MO_8) {
    opc = memop;
  }
  if ((tcg_ctx->tb_cflags & 0x80000) == 0) {
    pTVar2 = tcg_temp_new_internal_riscv32(tcg_ctx,TCG_TYPE_I64,false);
    val = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx);
    pTVar3 = tcg_temp_new_internal_riscv32(tcg_ctx,TCG_TYPE_I64,false);
    uVar1 = opc << 4 & 0xffffff30;
    if ((opc & MO_64) != MO_8) {
      uVar1 = opc << 4;
    }
    tcg_gen_ext_i64(tcg_ctx,(TCGv_i64)((long)pTVar3 - (long)tcg_ctx),cmpv,opc & MO_64);
    tcg_gen_qemu_ld_i64_riscv32(tcg_ctx,val,addr,idx,opc & ~MO_ASHIFT);
    pTVar4 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_movcond_i64);
    pTVar4->args[0] = (TCGArg)pTVar3;
    pTVar4->args[1] = (TCGArg)pTVar2;
    pTVar4->args[2] = (TCGArg)pTVar3;
    pTVar4->args[3] = (TCGArg)(newv + (long)tcg_ctx);
    pTVar4->args[4] = (TCGArg)pTVar2;
    pTVar4->args[5] = 8;
    local_58 = (uint)idx;
    pTVar4 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_qemu_st_i64);
    pTVar4->args[0] = (TCGArg)pTVar3;
    pTVar4->args[1] = (TCGArg)(addr + (long)tcg_ctx);
    pTVar4->args[2] = (ulong)(uVar1 & 0xffffffb0 | local_58);
    check_exit_request_riscv32(tcg_ctx);
    tcg_temp_free_internal_riscv32(tcg_ctx,pTVar3);
    if ((opc & MO_ASHIFT) == MO_8) {
      if (val != retv) {
        pTVar4 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_mov_i64);
        pTVar4->args[0] = (TCGArg)(retv + (long)tcg_ctx);
        pTVar4->args[1] = (TCGArg)pTVar2;
      }
    }
    else {
      tcg_gen_ext_i64(tcg_ctx,retv,val,opc);
    }
    tcg_temp_free_internal_riscv32(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    return;
  }
  if ((~opc & 3) == 0) {
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_riscv32(tcg_ctx,helper_exit_atomic_riscv32,(TCGTemp *)0x0,1,&local_38);
    pTVar4 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_movi_i64);
    pTVar4->args[0] = (TCGArg)(retv + (long)tcg_ctx);
    pTVar4->args[1] = 0;
  }
  else {
    pTVar2 = tcg_temp_new_internal_riscv32(tcg_ctx,TCG_TYPE_I32,false);
    pTVar3 = tcg_temp_new_internal_riscv32(tcg_ctx,TCG_TYPE_I32,false);
    ts = tcg_temp_new_internal_riscv32(tcg_ctx,TCG_TYPE_I32,false);
    pTVar4 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_extrl_i64_i32);
    pTVar4->args[0] = (TCGArg)pTVar2;
    pTVar4->args[1] = (TCGArg)(cmpv + (long)tcg_ctx);
    pTVar4 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_extrl_i64_i32);
    pTVar4->args[0] = (TCGArg)pTVar3;
    pTVar4->args[1] = (TCGArg)(newv + (long)tcg_ctx);
    tcg_gen_atomic_cmpxchg_i32_riscv32
              (tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),addr,
               (TCGv_i32)((long)pTVar2 - (long)tcg_ctx),(TCGv_i32)((long)pTVar3 - (long)tcg_ctx),idx
               ,opc & ~MO_ASHIFT);
    tcg_temp_free_internal_riscv32(tcg_ctx,pTVar2);
    tcg_temp_free_internal_riscv32(tcg_ctx,pTVar3);
    pTVar4 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_extu_i32_i64);
    pTVar4->args[0] = (TCGArg)(retv + (long)&tcg_ctx->pool_cur);
    pTVar4->args[1] = (TCGArg)ts;
    tcg_temp_free_internal_riscv32(tcg_ctx,ts);
    if ((opc & MO_ASHIFT) != MO_8) {
      tcg_gen_ext_i64(tcg_ctx,retv,retv,opc);
      return;
    }
  }
  return;
}

Assistant:

void tcg_gen_atomic_cmpxchg_i64(TCGContext *tcg_ctx, TCGv_i64 retv, TCGv addr, TCGv_i64 cmpv,
                                TCGv_i64 newv, TCGArg idx, MemOp memop)
{
    memop = tcg_canonicalize_memop(memop, 1, 0);

    if (!(tcg_ctx->tb_cflags & CF_PARALLEL)) {
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_ext_i64(tcg_ctx, t2, cmpv, memop & MO_SIZE);

        tcg_gen_qemu_ld_i64(tcg_ctx, t1, addr, idx, memop & ~MO_SIGN);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t2, t1, t2, newv, t1);
        tcg_gen_qemu_st_i64(tcg_ctx, t2, addr, idx, memop);
        tcg_temp_free_i64(tcg_ctx, t2);

        if (memop & MO_SIGN) {
            tcg_gen_ext_i64(tcg_ctx, retv, t1, memop);
        } else {
            tcg_gen_mov_i64(tcg_ctx, retv, t1);
        }
        tcg_temp_free_i64(tcg_ctx, t1);
    } else if ((memop & MO_SIZE) == MO_64) {
#ifdef CONFIG_ATOMIC64
        gen_atomic_cx_i64 gen;

        gen = table_cmpxchg[memop & (MO_SIZE | MO_BSWAP)];
        tcg_debug_assert(gen != NULL);

        {
            TCGv_i32 oi = tcg_const_i32(tcg_ctx, make_memop_idx(memop, idx));
            gen(tcg_ctx, retv, tcg_ctx->cpu_env, addr, cmpv, newv, oi);
            tcg_temp_free_i32(tcg_ctx, oi);
        }
#else
        gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
        /* Produce a result, so that we have a well-formed opcode stream
           with respect to uses of the result in the (dead) code following.  */
        tcg_gen_movi_i64(tcg_ctx, retv, 0);
#endif /* CONFIG_ATOMIC64 */
    } else {
        TCGv_i32 c32 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 n32 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 r32 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_extrl_i64_i32(tcg_ctx, c32, cmpv);
        tcg_gen_extrl_i64_i32(tcg_ctx, n32, newv);
        tcg_gen_atomic_cmpxchg_i32(tcg_ctx, r32, addr, c32, n32, idx, memop & ~MO_SIGN);
        tcg_temp_free_i32(tcg_ctx, c32);
        tcg_temp_free_i32(tcg_ctx, n32);

        tcg_gen_extu_i32_i64(tcg_ctx, retv, r32);
        tcg_temp_free_i32(tcg_ctx, r32);

        if (memop & MO_SIGN) {
            tcg_gen_ext_i64(tcg_ctx, retv, retv, memop);
        }
    }
}